

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tester.cpp
# Opt level: O2

void StdSprintf(void)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  int iVar4;
  bool bVar5;
  undefined1 local_1420 [8];
  random_device _rdev;
  char buf [64];
  param_type local_50;
  uniform_int_distribution<int> _dist;
  ResultType _result;
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> _prof;
  
  poVar3 = std::operator<<((ostream *)&std::cout,"sprintf");
  std::operator<<(poVar3,"... ");
  std::ostream::flush();
  std::random_device::random_device((random_device *)local_1420);
  local_50._M_a = -0x80000000;
  local_50._M_b = 0x7fffffff;
  _result.__r = (rep)&_dist;
  std::chrono::_V2::steady_clock::now();
  iVar4 = 10000000;
  while (bVar5 = iVar4 != 0, iVar4 = iVar4 + -1, bVar5) {
    uVar2 = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&local_50,(random_device *)local_1420);
    sprintf(_rdev.field_0.field2 + 0x1380,"%d",(ulong)uVar2);
  }
  Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_>::~Profiler
            ((Profiler<std::chrono::duration<double,_std::ratio<1L,_1L>_>_> *)&_result);
  std::random_device::~random_device((random_device *)local_1420);
  lVar1 = std::cout;
  *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::locale::classic + *(long *)(std::cout + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(lVar1 + -0x18)) = 3;
  poVar3 = std::ostream::_M_insert<double>((double)_dist._M_param);
  poVar3 = std::operator<<(poVar3,"s");
  std::endl<char,std::char_traits<char>>(poVar3);
  return;
}

Assistant:

void StdSprintf()
{
    char buf[64];
    RANDOM_PROFILING_BEGIN("sprintf")
    sprintf(buf, PrintfFormat<number_t>(), i);
    RANDOM_PROFILING_END()
}